

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall
lexer_exception::lexer_exception(lexer_exception *this,LexerPosition *position,string *msg)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  long *plVar5;
  stringstream buffer;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  *(undefined ***)this = &PTR__lexer_exception_001539e8;
  (this->position_).super_Position._vptr_Position = (_func_int **)&PTR_clear_001539d0;
  iVar2 = (position->super_Position).col_;
  (this->position_).super_Position.row_ = (position->super_Position).row_;
  (this->position_).super_Position.col_ = iVar2;
  (this->position_).super_Position._vptr_Position = (_func_int **)&PTR_clear_00153990;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg_,pcVar1,pcVar1 + msg->_M_string_length);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,anon_var_dwarf_b4ebe + 9,4);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,(this->position_).super_Position.row_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_48de5,9);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->position_).super_Position.col_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_48dfe,6);
  std::__cxx11::stringbuf::str();
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_1e8,(ulong)(this->msg_)._M_dataplus._M_p);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_1b8 = *plVar5;
    lStack_1b0 = plVar4[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar5;
    local_1c8 = (long *)*plVar4;
  }
  local_1c0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

explicit lexer_exception(const LexerPosition &position, const std::string &msg) : position_(position), msg_(msg) {
        std::stringstream buffer;
        buffer << "第 " << position_.row() << " 行 第 " << position_.col() << " 列: ";
        msg_ = buffer.str() + msg_;
    }